

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O1

string_view gmlc::utilities::string_viewOps::trim(string_view input,string_view trimCharacters)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  pcVar6 = input._M_str;
  uVar3 = input._M_len;
  __n = trimCharacters._M_len;
  uVar4 = 0xffffffffffffffff;
  local_40._M_len = uVar3;
  local_40._M_str = pcVar6;
  if (uVar3 != 0) {
    if (__n == 0) {
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        pvVar1 = memchr(trimCharacters._M_str,(int)pcVar6[uVar5],__n);
        uVar4 = uVar5;
        if (pvVar1 == (void *)0x0) break;
        uVar5 = uVar5 + 1;
        uVar4 = 0xffffffffffffffff;
      } while (uVar3 != uVar5);
    }
  }
  if (uVar4 == 0xffffffffffffffff) {
    uVar3 = 0;
    local_40._M_str = (char *)0x0;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&local_40,trimCharacters._M_str,0xffffffffffffffff,__n);
    if (local_40._M_len < uVar4) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar4);
    }
    uVar3 = (sVar2 - uVar4) + 1;
    if (local_40._M_len - uVar4 < uVar3) {
      uVar3 = local_40._M_len - uVar4;
    }
    local_40._M_str = local_40._M_str + uVar4;
  }
  sVar7._M_str = local_40._M_str;
  sVar7._M_len = uVar3;
  return sVar7;
}

Assistant:

std::string_view trim(std::string_view input, std::string_view trimCharacters)
{
    const auto strStart = input.find_first_not_of(trimCharacters);
    if (strStart == std::string::npos) {
        return {};  // no content
    }

    const auto strEnd = input.find_last_not_of(trimCharacters);

    return input.substr(strStart, strEnd - strStart + 1);
}